

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2min_distance_targets.cc
# Opt level: O2

bool __thiscall
S2MinDistanceEdgeTarget::VisitContainingShapes
          (S2MinDistanceEdgeTarget *this,S2ShapeIndex *index,ShapeVisitor *visitor)

{
  bool bVar1;
  S2MinDistancePointTarget local_58;
  double local_38;
  double dStack_30;
  double local_28;
  
  local_28 = (this->a_).c_[2] + (this->b_).c_[2];
  local_38 = (this->b_).c_[0] + (this->a_).c_[0];
  dStack_30 = (this->b_).c_[1] + (this->a_).c_[1];
  util::math::internal_vector::BasicVector<Vector3,_double,_3UL>::Normalize
            (&local_58.point_,(BasicVector<Vector3,_double,_3UL> *)&local_38);
  local_58.super_S2MinDistanceTarget._vptr_S2DistanceTarget =
       (_func_int **)&PTR__S2DistanceTarget_003059a8;
  bVar1 = S2MinDistancePointTarget::VisitContainingShapes(&local_58,index,visitor);
  return bVar1;
}

Assistant:

bool S2MinDistanceEdgeTarget::VisitContainingShapes(
    const S2ShapeIndex& index, const ShapeVisitor& visitor) {
  // We test the center of the edge in order to ensure that edge targets AB
  // and BA yield identical results (which is not guaranteed by the API but
  // users might expect).  Other options would be to test both endpoints, or
  // return different results for AB and BA in some cases.
  S2MinDistancePointTarget target((a_ + b_).Normalize());
  return target.VisitContainingShapes(index, visitor);
}